

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,char *command,string *output,int *retVal,char *dir,int timeout,ostream *ofs
          )

{
  int cc;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  cmsysProcess *cp;
  long lVar4;
  char *pcVar5;
  pointer ppcVar6;
  ulong uVar7;
  ulong uVar8;
  const_iterator a;
  pointer pbVar9;
  cmCTestLogWrite local_238 [2];
  string *local_218;
  int length;
  char *data;
  int local_1fc;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  
  local_218 = output;
  cmSystemTools::ParseArguments_abi_cxx11_(&args,(cmSystemTools *)command,(char *)output);
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar1 = 0;
    goto LAB_002a4dea;
  }
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1fc = timeout;
  for (pbVar9 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
    _cmCTestLog_msg = (pbVar9->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  }
  _cmCTestLog_msg = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  std::__cxx11::string::assign((char *)local_218);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,"Run command:");
  std::__cxx11::stringbuf::str();
  Log(this,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x49c,local_238[0].Data,false);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  for (ppcVar6 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (ppcVar6 !=
       argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish && (*ppcVar6 != (char *)0x0)); ppcVar6 = ppcVar6 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," \"");
    poVar3 = std::operator<<(poVar3,*ppcVar6);
    std::operator<<(poVar3,"\"");
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4a0,local_238[0].Data,false);
    std::__cxx11::string::~string((string *)local_238);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
  std::__cxx11::stringbuf::str();
  Log(this,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x4a2,local_238[0].Data,false);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_SetTimeout(cp,(double)local_1fc);
  cmsysProcess_Execute(cp);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Each . represents ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," bytes of output");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"    ");
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,2,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x4b5,local_238[0].Data,false);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  uVar7 = 0;
  while (iVar1 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar1 != 0) {
    for (lVar4 = 0; lVar4 < length; lVar4 = lVar4 + 1) {
      if (data[lVar4] == '\0') {
        data[lVar4] = '\n';
      }
    }
    std::__cxx11::string::append((char *)local_218,(ulong)data);
    lVar4 = -uVar7;
    uVar8 = uVar7 << 10;
    while( true ) {
      uVar7 = uVar7 + 1;
      if (local_218->_M_string_length <= uVar8) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator<<((ostream *)&cmCTestLog_msg,".");
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
          ,0x4c3,local_238[0].Data,false);
      std::__cxx11::string::~string((string *)local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      if ((lVar4 != 1) && ((uVar7 / 0x32) * -0x32 + 1 == lVar4)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"  Size: ");
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (poVar3,(int)((((double)CONCAT44(0x45300000,
                                                            (int)(local_218->_M_string_length >>
                                                                 0x20)) - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,
                                                           (int)local_218->_M_string_length) -
                                         4503599627370496.0)) * 0.0009765625 + 1.0));
        poVar3 = std::operator<<(poVar3,"K");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        std::operator<<(poVar3,"    ");
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
            ,0x4ca,local_238[0].Data,false);
        std::__cxx11::string::~string((string *)local_238);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      lVar4 = lVar4 + -1;
      uVar8 = uVar8 + 0x400;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    local_238[0].Length = (size_t)length;
    local_238[0].Data = data;
    operator<<((ostream *)&cmCTestLog_msg,local_238);
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4cd,local_238[0].Data,false);
    uVar7 = -lVar4;
    std::__cxx11::string::~string((string *)local_238);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (((&ofs->field_0x20)[(long)ofs->_vptr_basic_ostream[-3]] & 5) == 0) {
      _cmCTestLog_msg = data;
      operator<<(ofs,(cmCTestLogWrite *)&cmCTestLog_msg);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," Size of output: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(int)((((double)CONCAT44(0x45300000,
                                                      (int)(local_218->_M_string_length >> 0x20)) -
                                    1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)local_218->_M_string_length) -
                                   4503599627370496.0)) * 0.0009765625));
  poVar3 = std::operator<<(poVar3,"K");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  Log(this,1,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x4d4,local_238[0].Data,false);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar1 = cmsysProcess_GetState(cp);
  switch(iVar1) {
  case 1:
    std::__cxx11::string::append((char *)local_218);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)local_218);
    std::__cxx11::string::append((char *)local_218);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an error: ");
    pcVar5 = cmsysProcess_GetErrorString(cp);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4f0,local_238[0].Data,false);
    break;
  case 2:
    iVar2 = cmsysProcess_GetExitException(cp);
    *retVal = iVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an exception: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*retVal);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4e4,local_238[0].Data,false);
    break;
  default:
    goto switchD_002a4bc6_caseD_3;
  case 4:
    iVar2 = cmsysProcess_GetExitValue(cp);
    *retVal = iVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Command exited with the value: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*retVal);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4de,local_238[0].Data,false);
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"There was a timeout");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x4e8,local_238[0].Data,false);
  }
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
switchD_002a4bc6_caseD_3:
  cmsysProcess_Delete(cp);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
LAB_002a4dea:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return iVar1;
}

Assistant:

int cmCTest::RunMakeCommand(const char* command, std::string& output,
  int* retVal, const char* dir, int timeout, std::ostream& ofs)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if(args.size() < 1)
    {
    return false;
    }

  std::vector<const char*> argv;
  for(std::vector<std::string>::const_iterator a = args.begin();
    a != args.end(); ++a)
    {
    argv.push_back(a->c_str());
    }
  argv.push_back(0);

  output = "";
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  std::vector<const char*>::iterator ait;
  for ( ait = argv.begin(); ait != argv.end() && *ait; ++ ait )
    {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << *ait << "\"");
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmCTestLog(this, HANDLER_OUTPUT,
    "   Each . represents " << tick_len << " bytes of output" << std::endl
    << "    " << std::flush);
  while(cmsysProcess_WaitForData(cp, &data, &length, 0))
    {
    for(int cc =0; cc < length; ++cc)
      {
      if(data[cc] == 0)
        {
        data[cc] = '\n';
        }
      }
    output.append(data, length);
    while ( output.size() > (tick * tick_len) )
      {
      tick ++;
      cmCTestLog(this, HANDLER_OUTPUT, "." << std::flush);
      if ( tick % tick_line_len == 0 && tick > 0 )
        {
        cmCTestLog(this, HANDLER_OUTPUT,
                   "  Size: "
                   << int((double(output.size()) / 1024.0) + 1)
                   << "K" << std::endl
                   << "    " << std::flush);
        }
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, cmCTestLogWrite(data, length));
    if ( ofs )
      {
      ofs << cmCTestLogWrite(data, length);
      }
    }
  cmCTestLog(this, OUTPUT, " Size of output: "
    << int(double(output.size()) / 1024.0) << "K" << std::endl);

  cmsysProcess_WaitForExit(cp, 0);

  int result = cmsysProcess_GetState(cp);

  if(result == cmsysProcess_State_Exited)
    {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Command exited with the value: "
      << *retVal << std::endl);
    }
  else if(result == cmsysProcess_State_Exception)
    {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING, "There was an exception: " << *retVal
      << std::endl);
    }
  else if(result == cmsysProcess_State_Expired)
    {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
    }
  else if(result == cmsysProcess_State_Error)
    {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE, "There was an error: "
      << cmsysProcess_GetErrorString(cp) << std::endl);
    }

  cmsysProcess_Delete(cp);

  return result;
}